

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v1.cpp
# Opt level: O0

void __thiscall
intel_keym_v1_t::signature_t::signature_t
          (signature_t *this,kstream *p__io,key_signature_t *p__parent,intel_keym_v1_t *p__root)

{
  intel_keym_v1_t *p__root_local;
  key_signature_t *p__parent_local;
  kstream *p__io_local;
  signature_t *this_local;
  
  kaitai::kstruct::kstruct(&this->super_kstruct,p__io);
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__signature_t_0037b868;
  std::__cxx11::string::string((string *)&this->m_signature);
  this->m__parent = p__parent;
  this->m__root = p__root;
  _read(this);
  return;
}

Assistant:

intel_keym_v1_t::signature_t::signature_t(kaitai::kstream* p__io, intel_keym_v1_t::key_signature_t* p__parent, intel_keym_v1_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    _read();
}